

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

Territory __thiscall QTimeZone::territory(QTimeZone *this)

{
  QTimeZonePrivate *this_00;
  bool bVar1;
  Territory TVar2;
  int iVar3;
  long in_FS_OFFSET;
  QTimeZone QStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d;
  if (((ulong)this_00 & 3) == 0) {
    if (this_00 != (QTimeZonePrivate *)0x0) {
      bVar1 = QTimeZonePrivate::isValid(this_00);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          iVar3 = (*((this->d).d)->_vptr_QTimeZonePrivate[3])();
          return (Territory)iVar3;
        }
        goto LAB_003502be;
      }
    }
LAB_0035027d:
    TVar2 = AnyCountry;
  }
  else {
    if (((int)this_00 - 1U & 3) != 0) goto LAB_0035027d;
    systemTimeZone();
    TVar2 = territory(&QStack_18);
    ~QTimeZone(&QStack_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return TVar2;
  }
LAB_003502be:
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QTimeZone::territory() const
{
    if (d.isShort()) {
        if (d.s.spec() == Qt::LocalTime)
            return systemTimeZone().territory();
    } else if (isValid()) {
        return d->territory();
    }
    return QLocale::AnyTerritory;
}